

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O1

uint xkb_mask_modifier(XkbDescPtr xkb,char *name)

{
  int iVar1;
  uint uVar2;
  char *__s2;
  ulong uVar3;
  bool bVar4;
  uint mask;
  int local_2c;
  
  local_2c = 0;
  iVar1 = strcmp(name,"Caps Lock");
  if (iVar1 == 0) {
    uVar2 = 2;
  }
  else {
    uVar2 = 0;
    if (local_2c == 0) {
      uVar3 = 0;
      do {
        if ((xkb->names->vmods[uVar3] != 0) &&
           (__s2 = (char *)XGetAtomName(xkb->dpy), __s2 != (char *)0x0)) {
          iVar1 = strcmp(name,__s2);
          if (iVar1 == 0) {
            XkbVirtualModsToReal(xkb,1 << ((byte)uVar3 & 0x1f),&local_2c);
          }
          XFree(__s2);
        }
        uVar2 = 0;
      } while ((local_2c == 0) && (bVar4 = uVar3 < 0xf, uVar3 = uVar3 + 1, bVar4));
    }
  }
  return uVar2;
}

Assistant:

static unsigned int xkb_mask_modifier( XkbDescPtr xkb, const char *name )
{
	unsigned int mask=0;
	
	if (streq(name, "Caps Lock")) return 2;
	
	for (int i = 0; (!mask) && (i < XkbNumVirtualMods); i++ ) {
		char* modStr;

		/* Avoid BadAtom errors:  skip elements with a null atom. */
		if (xkb->names->vmods[i] == None) {
		        continue;
		}
		modStr = XGetAtomName( xkb->dpy, xkb->names->vmods[i] );
		if (modStr) {
			if (streq(name, modStr))
				XkbVirtualModsToReal( xkb, 1U << i, &mask );

			XFree(modStr);
		}
	}
	return 0;
}